

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputCase10::Run(BasicInputCase10 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  long lVar2;
  GLuint i;
  GLuint index;
  undefined8 local_38;
  undefined4 local_30;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  for (index = 0; index != 0x10; index = index + 1) {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,index,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x24,(void *)0x0,0x88e4);
  local_38 = 0x400000003f800000;
  local_30 = 0x40400000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0xc,&local_38);
  local_38 = 0x40a0000040800000;
  local_30 = 0x40c00000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,0xc,&local_38);
  local_38 = 0x4100000040e00000;
  local_30 = 0x41100000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x18,0xc,&local_38);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,2,0x1406,'\0',4);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,3);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0xc);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,3,this->m_vbo,4,8);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,0,1);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,3,0);
  (this->super_BasicInputBase).instance_count = 2;
  (this->super_BasicInputBase).base_instance = 1;
  (this->super_BasicInputBase).expected_data[0].m_data[0] = 4.0;
  (this->super_BasicInputBase).expected_data[0].m_data[1] = 5.0;
  (this->super_BasicInputBase).expected_data[0].m_data[2] = 6.0;
  (this->super_BasicInputBase).expected_data[0].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[2].m_data[0] = 3.0;
  (this->super_BasicInputBase).expected_data[2].m_data[1] = 4.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[0] = 4.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[1] = 5.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x10].m_data[2] = 6.0;
  pVVar1[0x10].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x12].m_data[2] = 0.0;
  pVVar1[0x12].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x20].m_data[0] = 7.0;
  (this->super_BasicInputBase).expected_data[0x20].m_data[1] = 8.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x20].m_data[2] = 9.0;
  pVVar1[0x20].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x22].m_data[0] = 3.0;
  (this->super_BasicInputBase).expected_data[0x22].m_data[1] = 4.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x22].m_data[2] = 0.0;
  pVVar1[0x22].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x30].m_data[0] = 7.0;
  (this->super_BasicInputBase).expected_data[0x30].m_data[1] = 8.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x30].m_data[2] = 9.0;
  pVVar1[0x30].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x32].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[0x32].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x32].m_data[2] = 0.0;
  pVVar1[0x32].m_data[3] = 1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec3) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec3), &Vec3(1.0f, 2.0f, 3.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(Vec3), &Vec3(4.0f, 5.0f, 6.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 24, sizeof(Vec3), &Vec3(7.0f, 8.0f, 9.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(2, 2, GL_FLOAT, GL_FALSE, 4);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(2, 3);
		glBindVertexBuffer(0, m_vbo, 0, 12);
		glBindVertexBuffer(3, m_vbo, 4, 8);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);
		glVertexBindingDivisor(0, 1);
		glVertexBindingDivisor(3, 0);

		instance_count		  = 2;
		base_instance		  = 1;
		expected_data[0]	  = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		expected_data[2]	  = Vec4(3.0f, 4.0f, 0.0f, 1.0f);
		expected_data[0 + 16] = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		expected_data[2 + 16] = Vec4(5.0f, 6.0f, 0.0f, 1.0f);

		expected_data[0 + 32]	  = Vec4(7.0f, 8.0f, 9.0f, 1.0f);
		expected_data[2 + 32]	  = Vec4(3.0f, 4.0f, 0.0f, 1.0f);
		expected_data[0 + 16 + 32] = Vec4(7.0f, 8.0f, 9.0f, 1.0f);
		expected_data[2 + 16 + 32] = Vec4(5.0f, 6.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}